

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTFlightData.cpp
# Opt level: O1

string * __thiscall
LTFlightData::FDKeyTy::SetKey_abi_cxx11_
          (string *__return_storage_ptr__,FDKeyTy *this,FDKeyType _eType,unsigned_long _num)

{
  long *plVar1;
  LTError *this_00;
  char *pcVar2;
  char buf [50];
  char local_58 [56];
  
  this->eKeyType = _eType;
  this->num = _num;
  local_58[0x20] = '\0';
  local_58[0x21] = '\0';
  local_58[0x22] = '\0';
  local_58[0x23] = '\0';
  local_58[0x24] = '\0';
  local_58[0x25] = '\0';
  local_58[0x26] = '\0';
  local_58[0x27] = '\0';
  local_58[0x28] = '\0';
  local_58[0x29] = '\0';
  local_58[0x2a] = '\0';
  local_58[0x2b] = '\0';
  local_58[0x2c] = '\0';
  local_58[0x2d] = '\0';
  local_58[0x2e] = '\0';
  local_58[0x2f] = '\0';
  local_58[0x10] = '\0';
  local_58[0x11] = '\0';
  local_58[0x12] = '\0';
  local_58[0x13] = '\0';
  local_58[0x14] = '\0';
  local_58[0x15] = '\0';
  local_58[0x16] = '\0';
  local_58[0x17] = '\0';
  local_58[0x18] = '\0';
  local_58[0x19] = '\0';
  local_58[0x1a] = '\0';
  local_58[0x1b] = '\0';
  local_58[0x1c] = '\0';
  local_58[0x1d] = '\0';
  local_58[0x1e] = '\0';
  local_58[0x1f] = '\0';
  local_58[0] = '\0';
  local_58[1] = '\0';
  local_58[2] = '\0';
  local_58[3] = '\0';
  local_58[4] = '\0';
  local_58[5] = '\0';
  local_58[6] = '\0';
  local_58[7] = '\0';
  local_58[8] = '\0';
  local_58[9] = '\0';
  local_58[10] = '\0';
  local_58[0xb] = '\0';
  local_58[0xc] = '\0';
  local_58[0xd] = '\0';
  local_58[0xe] = '\0';
  local_58[0xf] = '\0';
  local_58[0x30] = '\0';
  local_58[0x31] = '\0';
  switch(_eType) {
  case KEY_UNKNOWN:
    this_00 = (LTError *)__cxa_allocate_exception(0x18);
    LTError::LTError(this_00,
                     "/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTFlightData.cpp"
                     ,0x115,"SetKey",logFATAL,"ASSERT FAILED: %s","eKeyType!=KEY_UNKNOWN");
    goto LAB_0016b7e6;
  case KEY_OGN:
  case KEY_RT:
    pcVar2 = "%08lX";
    break;
  case KEY_FLARM:
  case KEY_ICAO:
  case KEY_FSC:
  case KEY_ADSBEX:
    pcVar2 = "%06lX";
    break;
  case KEY_SAYINTENTIONS:
    pcVar2 = "%lu";
    break;
  default:
    goto switchD_0016b721_default;
  }
  snprintf(local_58,0x32,pcVar2);
switchD_0016b721_default:
  if (local_58[0] != '\0') {
    pcVar2 = (char *)(this->key)._M_string_length;
    strlen(local_58);
    plVar1 = (long *)std::__cxx11::string::_M_replace((ulong)&this->key,0,pcVar2,(ulong)local_58);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,*plVar1,plVar1[1] + *plVar1);
    return __return_storage_ptr__;
  }
  this_00 = (LTError *)__cxa_allocate_exception(0x18);
  LTError::LTError(this_00,
                   "/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTFlightData.cpp"
                   ,0x118,"SetKey",logFATAL,"ASSERT FAILED: %s","buf[0]");
LAB_0016b7e6:
  __cxa_throw(this_00,&LTError::typeinfo,std::logic_error::~logic_error);
}

Assistant:

std::string LTFlightData::FDKeyTy::SetKey (FDKeyType _eType, unsigned long _num)
{
    eKeyType = _eType;
    num = _num;

    // convert to uppercase hex string
    char buf[50] = "";
    switch(_eType) {
        case KEY_ICAO:
        case KEY_FLARM:
        case KEY_FSC:
        case KEY_ADSBEX:
            snprintf(buf, sizeof(buf), "%06lX", _num);
            break;
        case KEY_OGN:
        case KEY_RT:
            snprintf(buf, sizeof(buf), "%08lX", _num);
            break;
        case KEY_SAYINTENTIONS:
            snprintf(buf, sizeof(buf), "%lu", _num);
            break;
        case KEY_UNKNOWN:
            // must not happen
            LOG_ASSERT(eKeyType!=KEY_UNKNOWN);
            break;
    }
    LOG_ASSERT(buf[0]);
    return key = buf;
}